

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void Qiniu_Client_InitEx(Qiniu_Client *self,Qiniu_Auth auth,size_t bufSize)

{
  void *pvVar1;
  
  memset(self,0,0xa0);
  pvVar1 = (void *)curl_easy_init();
  self->curl = pvVar1;
  (self->auth).self = auth.self;
  (self->auth).itbl = auth.itbl;
  self->hostsRetriesMax = 3;
  Qiniu_Buffer_Init(&self->b,bufSize);
  Qiniu_Buffer_Init(&self->respHeader,bufSize);
  return;
}

Assistant:

void Qiniu_Client_InitEx(Qiniu_Client *self, Qiniu_Auth auth, size_t bufSize)
{
    Qiniu_Zero_Ptr(self);
    self->curl = curl_easy_init();
    self->auth = auth;
    self->hostsRetriesMax = 3;

    Qiniu_Buffer_Init(&self->b, bufSize);
    Qiniu_Buffer_Init(&self->respHeader, bufSize);
}